

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int on_frame_recv(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  dynbuf *s;
  size_t *psVar1;
  uint8_t uVar2;
  FILEPROTO *pFVar3;
  int iVar4;
  uint32_t uVar5;
  CURLcode CVar6;
  CURLUcode CVar7;
  uint uVar8;
  CURLMcode CVar9;
  Curl_easy *pCVar10;
  size_t sVar11;
  char *pcVar12;
  CURL_conflict *pCVar13;
  HTTP *pHVar14;
  CURLU *u;
  char *pcVar15;
  ulong uVar16;
  bool bVar17;
  CURL_conflict *local_68;
  nghttp2_session *local_60;
  Curl_easy *local_58;
  char **local_50;
  FILEPROTO *local_48;
  curl_pushheaders heads;
  
  iVar4 = (frame->hd).stream_id;
  if (iVar4 == 0) {
    if ((frame->hd).type != '\x04') {
      return 0;
    }
    pCVar10 = *(Curl_easy **)((long)userp + 0x4a0);
    iVar4 = *(int *)((long)userp + 0x4e8);
    uVar5 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
    *(uint32_t *)((long)userp + 0x4e8) = uVar5;
    uVar5 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_ENABLE_PUSH);
    *(bool *)((long)userp + 0x4ec) = uVar5 != 0;
    if (iVar4 != *(int *)((long)userp + 0x4e8)) {
      Curl_infof(pCVar10,"Connection state changed (MAX_CONCURRENT_STREAMS == %u)!");
      pCVar10->multi->recheckstate = true;
      return 0;
    }
    return 0;
  }
  pCVar10 = (Curl_easy *)nghttp2_session_get_stream_user_data(session,iVar4);
  if (pCVar10 == (Curl_easy *)0x0) {
    return 0;
  }
  pHVar14 = (pCVar10->req).p.http;
  if (pHVar14 == (HTTP *)0x0) {
    return -0x386;
  }
  uVar2 = (frame->hd).type;
  local_60 = session;
  if (uVar2 != '\x05') {
    if (uVar2 == '\x01') {
      if (pHVar14->bodystarted != false) {
        return 0;
      }
      if (pHVar14->status_code == -1) {
        return -0x386;
      }
      if (99 < pHVar14->status_code - 100U) {
        pHVar14->bodystarted = true;
        pHVar14->status_code = -1;
      }
      s = &pHVar14->header_recvbuf;
      CVar6 = Curl_dyn_addn(s,"\r\n",2);
      if (CVar6 != CURLE_OK) {
        return -0x386;
      }
      sVar11 = Curl_dyn_len(s);
      uVar16 = sVar11 - pHVar14->nread_header_recvbuf;
      pcVar15 = pHVar14->mem;
      if (pHVar14->len < uVar16) {
        uVar16 = pHVar14->len;
      }
      sVar11 = pHVar14->memlen;
      pcVar12 = Curl_dyn_ptr(s);
      memcpy(pcVar15 + sVar11,pcVar12 + pHVar14->nread_header_recvbuf,uVar16);
      pHVar14->nread_header_recvbuf = pHVar14->nread_header_recvbuf + uVar16;
      pHVar14->len = pHVar14->len - uVar16;
      pHVar14->memlen = pHVar14->memlen + uVar16;
      psVar1 = &(pCVar10->state).drain;
      *psVar1 = *psVar1 + 1;
      *(long *)((long)userp + 0x4e0) = *(long *)((long)userp + 0x4e0) + 1;
      if (*(Curl_easy **)((long)userp + 0x4a0) == pCVar10) {
        return 0;
      }
      Curl_expire(pCVar10,0,EXPIRE_RUN_NOW);
      return 0;
    }
    if (uVar2 != '\0') {
      return 0;
    }
    if (pHVar14->bodystarted != false) {
      return 0;
    }
    iVar4 = nghttp2_submit_rst_stream(session,'\0',iVar4,1);
    iVar4 = nghttp2_is_fatal(iVar4);
    goto LAB_0010c32b;
  }
  if (pCVar10->multi->push_cb == (curl_push_callback)0x0) {
    bVar17 = false;
  }
  else {
    pCVar13 = curl_easy_duphandle(pCVar10);
    session = local_60;
    local_58 = pCVar13;
    if (pCVar13 == (CURL_conflict *)0x0) {
LAB_0010c2dc:
      bVar17 = false;
      Curl_infof(pCVar10,"failed to duplicate handle");
    }
    else {
      pHVar14 = (HTTP *)(*Curl_ccalloc)(1,0x2e8);
      if (pHVar14 == (HTTP *)0x0) {
        Curl_close(&local_58);
        local_68 = local_58;
        pCVar13 = local_58;
        if (local_58 == (CURL_conflict *)0x0) goto LAB_0010c2dc;
      }
      else {
        (pCVar13->req).p.http = pHVar14;
        Curl_dyn_init(&pHVar14->header_recvbuf,0x20000);
        pHVar14 = (pCVar13->req).p.http;
        pHVar14->bodystarted = false;
        pHVar14->status_code = -1;
        pHVar14->closed = false;
        pHVar14->error = 0;
        pHVar14->pausedata = (uint8_t *)0x0;
        pHVar14->pauselen = 0;
        pHVar14->close_handled = false;
        pHVar14->memlen = 0;
        pHVar14->mem = (char *)0x0;
        pHVar14->len = 0;
        (pCVar13->state).stream_weight = (pCVar10->state).stream_weight;
      }
      local_48 = (pCVar10->req).p.file;
      local_68 = pCVar13;
      heads.data = pCVar10;
      heads.frame = (nghttp2_push_promise *)frame;
      if (local_48 == (FILEPROTO *)0x0) {
        Curl_failf(pCVar10,"Internal NULL stream");
LAB_0010c309:
        bVar17 = false;
        Curl_close(&local_68);
      }
      else {
        local_58 = (CURL_conflict *)0x0;
        u = curl_url();
        if (u != (CURLU *)0x0) {
          pcVar15 = curl_pushheader_byname(&heads,":scheme");
          if ((((pcVar15 == (char *)0x0) ||
               (CVar7 = curl_url_set(u,CURLUPART_SCHEME,pcVar15,0), CVar7 == CURLUE_OK)) &&
              ((pcVar15 = curl_pushheader_byname(&heads,":authority"), pcVar15 == (char *)0x0 ||
               (CVar7 = curl_url_set(u,CURLUPART_HOST,pcVar15,0), CVar7 == CURLUE_OK)))) &&
             ((pcVar15 = curl_pushheader_byname(&heads,":path"), pcVar15 == (char *)0x0 ||
              (CVar7 = curl_url_set(u,CURLUPART_PATH,pcVar15,0), CVar7 == CURLUE_OK)))) {
            CVar7 = curl_url_get(u,CURLUPART_URL,(char **)&local_58,0);
            local_50 = (char **)CONCAT44(local_50._4_4_,CVar7);
            curl_url_cleanup(u);
            if ((int)local_50 == 0) {
              uVar8 = *(uint *)&(pCVar13->state).field_0x6d0;
              if ((uVar8 >> 0x11 & 1) != 0) {
                (*Curl_cfree)((pCVar13->state).url);
                uVar8 = *(uint *)&(pCVar13->state).field_0x6d0;
              }
              *(uint *)&(pCVar13->state).field_0x6d0 = uVar8 | 0x20000;
              (pCVar13->state).url = (char *)local_58;
              Curl_set_in_callback(pCVar10,true);
              pFVar3 = local_48;
              iVar4 = (*pCVar10->multi->push_cb)
                                (pCVar10,local_68,*(size_t *)&local_48[0x1b].fd,&heads,
                                 pCVar10->multi->push_userp);
              Curl_set_in_callback(pCVar10,false);
              local_50 = &pFVar3[0x1b].freepath;
              for (uVar16 = 0; uVar16 < *(ulong *)&local_48[0x1b].fd; uVar16 = uVar16 + 1) {
                (*Curl_cfree)(*(void **)(local_48[0x1b].freepath + uVar16 * 8));
              }
              (*Curl_cfree)(local_48[0x1b].freepath);
              local_50[0] = (char *)0x0;
              local_50[1] = (char *)0x0;
              pHVar14 = (local_68->req).p.http;
              if (iVar4 == 0) {
                pHVar14->stream_id = (frame->push_promise).promised_stream_id;
                *(undefined4 *)&(local_68->req).size = 0xffffffff;
                *(undefined4 *)((long)&(local_68->req).size + 4) = 0xffffffff;
                *(undefined4 *)&(local_68->req).maxdownload = 0xffffffff;
                *(undefined4 *)((long)&(local_68->req).maxdownload + 4) = 0xffffffff;
                CVar9 = Curl_multi_add_perform(pCVar10->multi,local_68,(connectdata *)userp);
                session = local_60;
                if (CVar9 != CURLM_OK) {
                  Curl_infof(pCVar10,"failed to add handle to multi");
                  http2_stream_free((local_68->req).p.http);
                  (local_68->req).p.file = (FILEPROTO *)0x0;
                  goto LAB_0010c309;
                }
                iVar4 = nghttp2_session_set_stream_user_data
                                  (*(nghttp2_session **)((long)userp + 0x4a8),
                                   (frame->push_promise).promised_stream_id,local_68);
                if (iVar4 == 0) {
                  Curl_dyn_init(&pHVar14->header_recvbuf,0x20000);
                  Curl_dyn_init(&pHVar14->trailer_recvbuf,0x20000);
                  return 0;
                }
                bVar17 = false;
                Curl_infof(pCVar10,"failed to set user_data for stream %u",
                           (ulong)(uint)(frame->push_promise).promised_stream_id);
              }
              else {
                http2_stream_free(pHVar14);
                (local_68->req).p.file = (FILEPROTO *)0x0;
                Curl_close(&local_68);
                bVar17 = iVar4 == 2;
                session = local_60;
              }
              goto LAB_0010c30e;
            }
          }
          else {
            curl_url_cleanup(u);
          }
        }
        Curl_close(&local_68);
        bVar17 = false;
      }
    }
  }
LAB_0010c30e:
  iVar4 = nghttp2_submit_rst_stream(session,'\0',(frame->push_promise).promised_stream_id,8);
  iVar4 = nghttp2_is_fatal(iVar4);
  if (bVar17) {
    return -0x386;
  }
LAB_0010c32b:
  if (iVar4 == 0) {
    return 0;
  }
  return -0x386;
}

Assistant:

static int on_frame_recv(nghttp2_session *session, const nghttp2_frame *frame,
                         void *userp)
{
  struct connectdata *conn = (struct connectdata *)userp;
  struct http_conn *httpc = &conn->proto.httpc;
  struct Curl_easy *data_s = NULL;
  struct HTTP *stream = NULL;
  struct Curl_easy *data = get_transfer(httpc);
  int rv;
  size_t left, ncopy;
  int32_t stream_id = frame->hd.stream_id;
  CURLcode result;

  if(!stream_id) {
    /* stream ID zero is for connection-oriented stuff */
    if(frame->hd.type == NGHTTP2_SETTINGS) {
      uint32_t max_conn = httpc->settings.max_concurrent_streams;
      H2BUGF(infof(data, "Got SETTINGS"));
      httpc->settings.max_concurrent_streams =
        nghttp2_session_get_remote_settings(
          session, NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
      httpc->settings.enable_push =
        nghttp2_session_get_remote_settings(
          session, NGHTTP2_SETTINGS_ENABLE_PUSH);
      H2BUGF(infof(data, "MAX_CONCURRENT_STREAMS == %d",
                   httpc->settings.max_concurrent_streams));
      H2BUGF(infof(data, "ENABLE_PUSH == %s",
                   httpc->settings.enable_push?"TRUE":"false"));
      if(max_conn != httpc->settings.max_concurrent_streams) {
        /* only signal change if the value actually changed */
        infof(data,
              "Connection state changed (MAX_CONCURRENT_STREAMS == %u)!",
              httpc->settings.max_concurrent_streams);
        multi_connchanged(data->multi);
      }
    }
    return 0;
  }
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    H2BUGF(infof(data,
                 "No Curl_easy associated with stream: %u",
                 stream_id));
    return 0;
  }

  stream = data_s->req.p.http;
  if(!stream) {
    H2BUGF(infof(data_s, "No proto pointer for stream: %u",
                 stream_id));
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  H2BUGF(infof(data_s, "on_frame_recv() header %x stream %u",
               frame->hd.type, stream_id));

  switch(frame->hd.type) {
  case NGHTTP2_DATA:
    /* If body started on this stream, then receiving DATA is illegal. */
    if(!stream->bodystarted) {
      rv = nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                     stream_id, NGHTTP2_PROTOCOL_ERROR);

      if(nghttp2_is_fatal(rv)) {
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      }
    }
    break;
  case NGHTTP2_HEADERS:
    if(stream->bodystarted) {
      /* Only valid HEADERS after body started is trailer HEADERS.  We
         buffer them in on_header callback. */
      break;
    }

    /* nghttp2 guarantees that :status is received, and we store it to
       stream->status_code. Fuzzing has proven this can still be reached
       without status code having been set. */
    if(stream->status_code == -1)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    /* Only final status code signals the end of header */
    if(stream->status_code / 100 != 1) {
      stream->bodystarted = TRUE;
      stream->status_code = -1;
    }

    result = Curl_dyn_addn(&stream->header_recvbuf, STRCONST("\r\n"));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    left = Curl_dyn_len(&stream->header_recvbuf) -
      stream->nread_header_recvbuf;
    ncopy = CURLMIN(stream->len, left);

    memcpy(&stream->mem[stream->memlen],
           Curl_dyn_ptr(&stream->header_recvbuf) +
           stream->nread_header_recvbuf,
           ncopy);
    stream->nread_header_recvbuf += ncopy;

    DEBUGASSERT(stream->mem);
    H2BUGF(infof(data_s, "Store %zu bytes headers from stream %u at %p",
                 ncopy, stream_id, stream->mem));

    stream->len -= ncopy;
    stream->memlen += ncopy;

    drain_this(data_s, httpc);
    /* if we receive data for another handle, wake that up */
    if(get_transfer(httpc) != data_s)
      Curl_expire(data_s, 0, EXPIRE_RUN_NOW);
    break;
  case NGHTTP2_PUSH_PROMISE:
    rv = push_promise(data_s, conn, &frame->push_promise);
    if(rv) { /* deny! */
      int h2;
      DEBUGASSERT((rv > CURL_PUSH_OK) && (rv <= CURL_PUSH_ERROROUT));
      h2 = nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                     frame->push_promise.promised_stream_id,
                                     NGHTTP2_CANCEL);
      if(nghttp2_is_fatal(h2))
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      else if(rv == CURL_PUSH_ERROROUT) {
        DEBUGF(infof(data_s, "Fail the parent stream (too)"));
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      }
    }
    break;
  default:
    H2BUGF(infof(data_s, "Got frame type %x for stream %u",
                 frame->hd.type, stream_id));
    break;
  }
  return 0;
}